

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O1

void __thiscall
ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test::
~ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test
          (ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTxOut, CreateDestroyAmountTxOutTest) {  
  ConfidentialTxOut txout;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  Amount amount = Amount::CreateBySatoshiAmount(980000000);
  EXPECT_NO_THROW((txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)));
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
            amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().ToString().c_str(), "OP_RETURN");
}